

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O3

void __thiscall OpenMD::Bond::~Bond(Bond *this)

{
  ~Bond(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

virtual ~Bond() {}